

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDCImporter::InternReadFile
          (MDCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  allocator<unsigned_char> *this_00;
  short sVar1;
  short sVar2;
  short sVar3;
  uint16_t p_iNormal;
  uint uVar4;
  IOStream *__p;
  pointer pIVar5;
  DeadlyImportError *pDVar6;
  reference pvVar7;
  aiMesh **ppaVar8;
  aiMesh *this_01;
  size_t sVar9;
  size_type sVar10;
  ulong uVar11;
  aiVector3D *paVar12;
  aiFace *paVar13;
  ulong *puVar14;
  void *pvVar15;
  Logger *this_02;
  aiNode *paVar16;
  uint *puVar17;
  aiNode **ppaVar18;
  aiMaterial **ppaVar19;
  aiMaterial *this_03;
  long lVar20;
  Surface *this_04;
  char *pcVar21;
  float fVar22;
  aiFace *local_7e0;
  aiFace *local_7b0;
  aiVector3t<float> *local_788;
  aiVector3t<float> *local_760;
  undefined1 local_67c [8];
  aiString path;
  aiColor3D clr;
  int iMode;
  string *name;
  aiMaterial *pcMat;
  uint i_4;
  aiNode *pcNode;
  uint i_3;
  float local_220;
  uint local_21c;
  uint32_t quak;
  uint iIndex;
  uint iOutIndex;
  uint iFace;
  int16_t *mdcCompVert;
  CompressedVertex *pcCVerts;
  BaseVertex *pcVerts;
  char *pcStack_1f0;
  int16_t iOfs;
  TexturCoord *pcUVs;
  Triangle *pcTriangle;
  aiFace *pcFaceCur;
  aiVector3D *pcUVCur;
  aiVector3D *pcNorCur;
  aiVector3D *pcVertCur;
  allocator local_199;
  value_type local_198;
  char *local_178;
  Shader *pcShader;
  string local_168;
  aiMesh *local_148;
  aiMesh *pcMesh;
  uint iNum;
  uint i_2;
  uint iDefaultMatIndex;
  uint i_1;
  uint i;
  uint iNumShaders;
  Surface *pcSurface2;
  Surface *pcSurface;
  Frame *pcFrame;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aszShaders;
  undefined1 local_f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  string local_d0;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  MDCImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar5 == (pointer)0x0) {
    local_a9 = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open MDC file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_88);
    local_a9 = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  uVar4 = (*pIVar5->_vptr_IOStream[6])();
  this->fileSize = uVar4;
  if (0x6f < this->fileSize) {
    uVar4 = this->fileSize;
    this_00 = (allocator<unsigned_char> *)
              ((long)&aszShaders.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_char>::allocator(this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,(ulong)uVar4,
               this_00);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&aszShaders.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0);
    (*pIVar5->_vptr_IOStream[2])(pIVar5,pvVar7,1,(ulong)this->fileSize);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,0);
    this->mBuffer = pvVar7;
    this->pcHeader = (Header *)this->mBuffer;
    ValidateHeader(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pcFrame);
    pcSurface = (Surface *)
                (this->mBuffer +
                (ulong)this->configFrameID * 0x38 + (ulong)this->pcHeader->ulOffsetBorderFrames);
    this_04 = (Surface *)(this->mBuffer + this->pcHeader->ulOffsetSurfaces);
    MDC::Surface::Surface(this_04);
    i_1 = 0;
    _i = this_04;
    pcSurface2 = this_04;
    for (iDefaultMatIndex = 0; iDefaultMatIndex < this->pcHeader->ulNumSurfaces;
        iDefaultMatIndex = iDefaultMatIndex + 1) {
      ValidateSurfaceHeader(this,_i);
      if ((_i->ulNumVertices != 0) && (_i->ulNumTriangles != 0)) {
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      i_1 = _i->ulNumShaders + i_1;
      uVar4 = _i->ulOffsetEnd;
      pcVar21 = _i->ucName;
      MDC::Surface::Surface((Surface *)(pcVar21 + ((ulong)uVar4 - 4)));
      _i = (Surface *)(pcVar21 + ((ulong)uVar4 - 4));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pcFrame,(ulong)i_1);
    ppaVar8 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
    pScene->mMeshes = ppaVar8;
    for (i_2 = 0; i_2 < pScene->mNumMeshes; i_2 = i_2 + 1) {
      pScene->mMeshes[i_2] = (aiMesh *)0x0;
    }
    iNum = 0xffffffff;
    pcMesh._0_4_ = 0;
    for (pcMesh._4_4_ = 0; pcMesh._4_4_ < this->pcHeader->ulNumSurfaces;
        pcMesh._4_4_ = pcMesh._4_4_ + 1) {
      if ((pcSurface2->ulNumVertices != 0) && (pcSurface2->ulNumTriangles != 0)) {
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        uVar11 = (ulong)(uint)pcMesh;
        pcMesh._0_4_ = (uint)pcMesh + 1;
        pScene->mMeshes[uVar11] = this_01;
        this_01->mNumFaces = pcSurface2->ulNumTriangles;
        this_01->mNumVertices = this_01->mNumFaces * 3;
        pcVar21 = pcSurface2->ucName;
        local_148 = this_01;
        sVar9 = strnlen(pcVar21,0x3f);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_168,pcVar21,sVar9,(allocator *)((long)&pcShader + 7));
        aiString::Set(&this_01->mName,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pcShader + 7));
        if (pcSurface2->ulNumShaders == 0) {
          if (iNum == 0xffffffff) {
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&pcFrame);
            iNum = (uint)sVar10;
            local_148->mMaterialIndex = iNum;
            std::__cxx11::string::string((string *)&pcVertCur);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pcFrame,(value_type *)&pcVertCur);
            std::__cxx11::string::~string((string *)&pcVertCur);
          }
          else {
            local_148->mMaterialIndex = iNum;
          }
        }
        else {
          local_178 = pcSurface2->ucName + ((ulong)pcSurface2->ulOffsetShaders - 4);
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pcFrame);
          pcVar21 = local_178;
          local_148->mMaterialIndex = (uint)sVar10;
          sVar9 = strnlen(local_178,0x40);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_198,pcVar21,sVar9,&local_199);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pcFrame,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
        }
        uVar11 = (ulong)local_148->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          local_760 = paVar12;
          do {
            aiVector3t<float>::aiVector3t(local_760);
            local_760 = local_760 + 1;
          } while (local_760 != paVar12 + uVar11);
        }
        local_148->mVertices = paVar12;
        uVar11 = (ulong)local_148->mNumVertices;
        pcNorCur = paVar12;
        paVar12 = (aiVector3D *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          local_788 = paVar12;
          do {
            aiVector3t<float>::aiVector3t(local_788);
            local_788 = local_788 + 1;
          } while (local_788 != paVar12 + uVar11);
        }
        local_148->mNormals = paVar12;
        uVar11 = (ulong)local_148->mNumVertices;
        pcUVCur = paVar12;
        paVar13 = (aiFace *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          local_7b0 = paVar13;
          do {
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_7b0);
            local_7b0 = (aiFace *)((long)&local_7b0->mIndices + 4);
          } while (local_7b0 != (aiFace *)(&paVar13->mNumIndices + uVar11 * 3));
        }
        local_148->mTextureCoords[0] = (aiVector3D *)paVar13;
        uVar11 = (ulong)local_148->mNumFaces;
        pcFaceCur = paVar13;
        puVar14 = (ulong *)operator_new__(uVar11 << 4 | 8);
        *puVar14 = uVar11;
        paVar13 = (aiFace *)(puVar14 + 1);
        if (uVar11 != 0) {
          local_7e0 = paVar13;
          do {
            aiFace::aiFace(local_7e0);
            local_7e0 = local_7e0 + 1;
          } while (local_7e0 != paVar13 + uVar11);
        }
        local_148->mFaces = paVar13;
        pcUVs = (TexturCoord *)(pcSurface2->ucName + ((ulong)pcSurface2->ulOffsetTriangles - 4));
        pcStack_1f0 = pcSurface2->ucName + ((ulong)pcSurface2->ulOffsetTexCoords - 4);
        pcVerts._6_2_ =
             *(short *)(pcSurface2->ucName +
                       (ulong)this->configFrameID * 2 + (ulong)pcSurface2->ulOffsetFrameBaseFrames +
                       -4);
        pcCVerts = (CompressedVertex *)
                   (pcSurface2->ucName +
                   (ulong)((int)pcVerts._6_2_ * pcSurface2->ulNumVertices * 4) * 8 +
                   (ulong)pcSurface2->ulOffsetBaseVerts + -4);
        mdcCompVert = (int16_t *)0x0;
        _iOutIndex = (char *)0x0;
        if ((this->configFrameID != 0) && (pcSurface2->ulNumCompFrames != 0)) {
          _iOutIndex = pcSurface2->ucName +
                       (ulong)this->configFrameID * 2 + (ulong)pcSurface2->ulOffsetFrameCompFrames +
                       -4;
          if (*(short *)_iOutIndex < 0) {
            _iOutIndex = (char *)0x0;
          }
          else {
            mdcCompVert = (int16_t *)
                          (pcSurface2->ucName +
                          (ulong)((int)*(short *)_iOutIndex * pcSurface2->ulNumVertices) * 4 +
                          (ulong)pcSurface2->ulOffsetCompVerts + -4);
          }
        }
        pcTriangle = (Triangle *)paVar13;
        for (iIndex = 0; iIndex < pcSurface2->ulNumTriangles; iIndex = iIndex + 1) {
          quak = iIndex * 3;
          pcTriangle->aiIndices[0] = 3;
          pvVar15 = operator_new__(0xc);
          *(void **)(pcTriangle->aiIndices + 2) = pvVar15;
          for (local_21c = 0; local_21c < 3; local_21c = local_21c + 1) {
            local_220 = (&pcUVs->u)[local_21c];
            if (pcSurface2->ulNumVertices <= (uint)local_220) {
              this_02 = DefaultLogger::get();
              Logger::error(this_02,"MDC vertex index is out of range");
              local_220 = (float)(pcSurface2->ulNumVertices - 1);
            }
            if (_iOutIndex == (char *)0x0) {
              sVar1._0_1_ = pcCVerts[(ulong)(uint)local_220 * 2].xd;
              sVar1._1_1_ = pcCVerts[(ulong)(uint)local_220 * 2].yd;
              pcNorCur->x = (float)(int)sVar1 * 0.015625;
              sVar2._0_1_ = pcCVerts[(ulong)(uint)local_220 * 2].zd;
              sVar2._1_1_ = pcCVerts[(ulong)(uint)local_220 * 2].nd;
              pcNorCur->y = (float)(int)sVar2 * 0.015625;
              sVar3._0_1_ = pcCVerts[(ulong)(uint)local_220 * 2 + 1].xd;
              sVar3._1_1_ = pcCVerts[(ulong)(uint)local_220 * 2 + 1].yd;
              pcNorCur->z = (float)(int)sVar3 * 0.015625;
              p_iNormal._0_1_ = pcCVerts[(ulong)(uint)local_220 * 2 + 1].zd;
              p_iNormal._1_1_ = pcCVerts[(ulong)(uint)local_220 * 2 + 1].nd;
              MD3::LatLngNormalToVec3(p_iNormal,&pcUVCur->x);
              pcFaceCur->mNumIndices = *(uint *)(pcStack_1f0 + (ulong)(uint)local_220 * 8);
              *(float *)&pcFaceCur->field_0x4 =
                   1.0 - *(float *)(pcStack_1f0 + (ulong)(uint)local_220 * 8 + 4);
            }
            else {
              MDC::BuildVertex((Frame *)pcSurface,
                               (BaseVertex *)(pcCVerts + (ulong)(uint)local_220 * 2),
                               (CompressedVertex *)(mdcCompVert + (ulong)(uint)local_220 * 2),
                               pcNorCur,pcUVCur);
            }
            fVar22 = aiVector3t<float>::operator[]
                               ((aiVector3t<float> *)(pcSurface->ucName + 0x14),0);
            pcNorCur->x = pcNorCur->x + fVar22;
            fVar22 = aiVector3t<float>::operator[]
                               ((aiVector3t<float> *)(pcSurface->ucName + 0x14),1);
            pcNorCur->y = pcNorCur->y + fVar22;
            fVar22 = aiVector3t<float>::operator[]
                               ((aiVector3t<float> *)(pcSurface->ucName + 0x14),2);
            pcNorCur->z = fVar22 + pcNorCur->z;
            pcNorCur = pcNorCur + 1;
            pcFaceCur = (aiFace *)((long)&pcFaceCur->mIndices + 4);
            pcUVCur = pcUVCur + 1;
          }
          **(int **)(pcTriangle->aiIndices + 2) = quak + 2;
          *(uint32_t *)(*(long *)(pcTriangle->aiIndices + 2) + 4) = quak + 1;
          *(uint32_t *)(*(long *)(pcTriangle->aiIndices + 2) + 8) = quak;
          pcUVs = (TexturCoord *)&pcUVs[1].v;
          pcTriangle = (Triangle *)(pcTriangle[1].aiIndices + 1);
        }
        uVar4 = pcSurface2->ulOffsetEnd;
        pcVar21 = pcSurface2->ucName;
        MDC::Surface::Surface((Surface *)(pcVar21 + ((ulong)uVar4 - 4)));
        pcSurface2 = (Surface *)(pcVar21 + ((ulong)uVar4 - 4));
      }
    }
    if (pScene->mNumMeshes != 0) {
      if (pScene->mNumMeshes == 1) {
        paVar16 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar16);
        pScene->mRootNode = paVar16;
        if (*pScene->mMeshes != (aiMesh *)0x0) {
          aiString::operator=(&pScene->mRootNode->mName,&(*pScene->mMeshes)->mName);
          pScene->mRootNode->mNumMeshes = 1;
          puVar17 = (uint *)operator_new__(4);
          pScene->mRootNode->mMeshes = puVar17;
          *pScene->mRootNode->mMeshes = 0;
        }
      }
      else {
        paVar16 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar16);
        pScene->mRootNode = paVar16;
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        ppaVar18 = (aiNode **)operator_new__((ulong)pScene->mNumMeshes << 3);
        pScene->mRootNode->mChildren = ppaVar18;
        aiString::Set(&pScene->mRootNode->mName,"<root>");
        for (pcNode._0_4_ = 0; (uint)pcNode < pScene->mNumMeshes; pcNode._0_4_ = (uint)pcNode + 1) {
          paVar16 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar16);
          pScene->mRootNode->mChildren[(uint)pcNode] = paVar16;
          paVar16->mParent = pScene->mRootNode;
          aiString::operator=((aiString *)paVar16,&pScene->mMeshes[(uint)pcNode]->mName);
          paVar16->mNumMeshes = 1;
          puVar17 = (uint *)operator_new__(4);
          paVar16->mMeshes = puVar17;
          *paVar16->mMeshes = (uint)pcNode;
        }
      }
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pcFrame);
      pScene->mNumMaterials = (uint)sVar10;
      ppaVar19 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
      pScene->mMaterials = ppaVar19;
      for (pcMat._4_4_ = 0; pcMat._4_4_ < pScene->mNumMaterials; pcMat._4_4_ = pcMat._4_4_ + 1) {
        this_03 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_03);
        pScene->mMaterials[pcMat._4_4_] = this_03;
        register0x00000000 =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pcFrame,(ulong)pcMat._4_4_);
        clr.g = 2.8026e-45;
        aiMaterial::AddProperty<int>(this_03,(int *)&clr.g,1,"$mat.shadingm",0,0);
        aiColor3D::aiColor3D((aiColor3D *)(path.data + 0x3f8));
        path.data[0x3f8] = -0x33;
        path.data[0x3f9] = -0x34;
        path.data[0x3fa] = 'L';
        path.data[0x3fb] = '=';
        path.data[0x3fc] = -0x33;
        path.data[0x3fd] = -0x34;
        path.data[0x3fe] = 'L';
        path.data[0x3ff] = '=';
        clr.r = 0.05;
        aiMaterial::AddProperty<aiColor3D>
                  (this_03,(aiColor3D *)(path.data + 0x3f8),1,"$clr.ambient",0,0);
        lVar20 = std::__cxx11::string::length();
        if (lVar20 == 0) {
          path.data[0x3f8] = -0x66;
          path.data[0x3f9] = -0x67;
          path.data[0x3fa] = '\x19';
          path.data[0x3fb] = '?';
          path.data[0x3fc] = -0x66;
          path.data[0x3fd] = -0x67;
          path.data[0x3fe] = '\x19';
          path.data[0x3ff] = '?';
          clr.r = 0.6;
        }
        else {
          path.data[0x3f8] = '\0';
          path.data[0x3f9] = '\0';
          path.data[0x3fa] = -0x80;
          path.data[0x3fb] = '?';
          path.data[0x3fc] = '\0';
          path.data[0x3fd] = '\0';
          path.data[0x3fe] = -0x80;
          path.data[0x3ff] = '?';
          clr.r = 1.0;
        }
        aiMaterial::AddProperty<aiColor3D>
                  (this_03,(aiColor3D *)(path.data + 0x3f8),1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>
                  (this_03,(aiColor3D *)(path.data + 0x3f8),1,"$clr.specular",0,0);
        lVar20 = std::__cxx11::string::length();
        if (lVar20 != 0) {
          aiString::aiString((aiString *)local_67c);
          aiString::Set((aiString *)local_67c,stack0xfffffffffffffd98);
          aiMaterial::AddProperty(this_03,(aiString *)local_67c,"$tex.file",1,0);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pcFrame);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_30);
      return;
    }
    pcNode._6_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&i_3,"Invalid MDC file: File contains no valid mesh",
               (allocator *)((long)&pcNode + 7));
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&i_3);
    pcNode._6_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"MDC File is too small.",
             (allocator *)
             ((long)&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  DeadlyImportError::DeadlyImportError(pDVar6,&local_d0);
  mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDCImporter::InternReadFile(
    const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MDC file " + pFile + ".");

    // check whether the mdc file is large enough to contain the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MDC::Header))
        throw DeadlyImportError( "MDC File is too small.");

    std::vector<unsigned char> mBuffer2(fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    // validate the file header
    this->pcHeader = (BE_NCONST MDC::Header*)this->mBuffer;
    this->ValidateHeader();

    std::vector<std::string> aszShaders;

    // get a pointer to the frame we want to read
    BE_NCONST MDC::Frame* pcFrame = (BE_NCONST MDC::Frame*)(this->mBuffer+
        this->pcHeader->ulOffsetBorderFrames);

    // no need to swap the other members, we won't need them
    pcFrame += configFrameID;
    AI_SWAP4( pcFrame->localOrigin[0] );
    AI_SWAP4( pcFrame->localOrigin[1] );
    AI_SWAP4( pcFrame->localOrigin[2] );

    // get the number of valid surfaces
    BE_NCONST MDC::Surface* pcSurface, *pcSurface2;
    pcSurface = pcSurface2 = new (mBuffer + pcHeader->ulOffsetSurfaces) MDC::Surface;
    unsigned int iNumShaders = 0;
    for (unsigned int i = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        // validate the surface header
        this->ValidateSurfaceHeader(pcSurface2);

        if (pcSurface2->ulNumVertices && pcSurface2->ulNumTriangles)++pScene->mNumMeshes;
        iNumShaders += pcSurface2->ulNumShaders;
        pcSurface2 = new ((int8_t*)pcSurface2 + pcSurface2->ulOffsetEnd) MDC::Surface;
    }
    aszShaders.reserve(iNumShaders);
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    // necessary that we don't crash if an exception occurs
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mMeshes[i] = NULL;

    // now read all surfaces
    unsigned int iDefaultMatIndex = UINT_MAX;
    for (unsigned int i = 0, iNum = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        if (!pcSurface->ulNumVertices || !pcSurface->ulNumTriangles)continue;
        aiMesh* pcMesh = pScene->mMeshes[iNum++] = new aiMesh();

        pcMesh->mNumFaces = pcSurface->ulNumTriangles;
        pcMesh->mNumVertices = pcMesh->mNumFaces * 3;

        // store the name of the surface for use as node name.
        pcMesh->mName.Set(std::string(pcSurface->ucName
                                    , strnlen(pcSurface->ucName, AI_MDC_MAXQPATH - 1)));

        // go to the first shader in the file. ignore the others.
        if (pcSurface->ulNumShaders)
        {
            const MDC::Shader* pcShader = (const MDC::Shader*)((int8_t*)pcSurface + pcSurface->ulOffsetShaders);
            pcMesh->mMaterialIndex = (unsigned int)aszShaders.size();

            // create a new shader
            aszShaders.push_back(std::string( pcShader->ucName, 
                ::strnlen(pcShader->ucName, sizeof(pcShader->ucName)) ));
        }
        // need to create a default material
        else if (UINT_MAX == iDefaultMatIndex)
        {
            pcMesh->mMaterialIndex = iDefaultMatIndex = (unsigned int)aszShaders.size();
            aszShaders.push_back(std::string());
        }
        // otherwise assign a reference to the default material
        else pcMesh->mMaterialIndex = iDefaultMatIndex;

        // allocate output storage for the mesh
        aiVector3D* pcVertCur   = pcMesh->mVertices         = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcNorCur    = pcMesh->mNormals          = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcUVCur     = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        aiFace* pcFaceCur       = pcMesh->mFaces            = new aiFace[pcMesh->mNumFaces];

        // create all vertices/faces
        BE_NCONST MDC::Triangle* pcTriangle = (BE_NCONST MDC::Triangle*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTriangles);

        BE_NCONST MDC::TexturCoord* const pcUVs = (BE_NCONST MDC::TexturCoord*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTexCoords);

        // get a pointer to the uncompressed vertices
        int16_t iOfs = *((int16_t*) ((int8_t*) pcSurface +
            pcSurface->ulOffsetFrameBaseFrames) +  this->configFrameID);

        AI_SWAP2(iOfs);

        BE_NCONST MDC::BaseVertex* const pcVerts = (BE_NCONST MDC::BaseVertex*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetBaseVerts) +
            ((int)iOfs * pcSurface->ulNumVertices * 4);

        // do the main swapping stuff ...
#if (defined AI_BUILD_BIG_ENDIAN)

        // swap all triangles
        for (unsigned int i = 0; i < pcSurface->ulNumTriangles;++i)
        {
            AI_SWAP4( pcTriangle[i].aiIndices[0] );
            AI_SWAP4( pcTriangle[i].aiIndices[1] );
            AI_SWAP4( pcTriangle[i].aiIndices[2] );
        }

        // swap all vertices
        for (unsigned int i = 0; i < pcSurface->ulNumVertices*pcSurface->ulNumBaseFrames;++i)
        {
            AI_SWAP2( pcVerts->normal );
            AI_SWAP2( pcVerts->x );
            AI_SWAP2( pcVerts->y );
            AI_SWAP2( pcVerts->z );
        }

        // swap all texture coordinates
        for (unsigned int i = 0; i < pcSurface->ulNumVertices;++i)
        {
            AI_SWAP4( pcUVs->v );
            AI_SWAP4( pcUVs->v );
        }

#endif

        const MDC::CompressedVertex* pcCVerts = NULL;
        int16_t* mdcCompVert = NULL;

        // access compressed frames for large frame numbers, but never for the first
        if( this->configFrameID && pcSurface->ulNumCompFrames > 0 )
        {
            mdcCompVert = (int16_t*) ((int8_t*)pcSurface+pcSurface->ulOffsetFrameCompFrames) + this->configFrameID;
            AI_SWAP2P(mdcCompVert);
            if( *mdcCompVert >= 0 )
            {
                pcCVerts = (const MDC::CompressedVertex*)((int8_t*)pcSurface +
                    pcSurface->ulOffsetCompVerts) + *mdcCompVert * pcSurface->ulNumVertices;
            }
            else mdcCompVert = NULL;
        }

        // copy all faces
        for (unsigned int iFace = 0; iFace < pcSurface->ulNumTriangles;++iFace,
            ++pcTriangle,++pcFaceCur)
        {
            const unsigned int iOutIndex = iFace*3;
            pcFaceCur->mNumIndices = 3;
            pcFaceCur->mIndices = new unsigned int[3];

            for (unsigned int iIndex = 0; iIndex < 3;++iIndex,
                ++pcVertCur,++pcUVCur,++pcNorCur)
            {
                uint32_t quak = pcTriangle->aiIndices[iIndex];
                if (quak >= pcSurface->ulNumVertices)
                {
                    ASSIMP_LOG_ERROR("MDC vertex index is out of range");
                    quak = pcSurface->ulNumVertices-1;
                }

                // compressed vertices?
                if (mdcCompVert)
                {
                    MDC::BuildVertex(*pcFrame,pcVerts[quak],pcCVerts[quak],
                        *pcVertCur,*pcNorCur);
                }
                else
                {
                    // copy position
                    pcVertCur->x = pcVerts[quak].x * AI_MDC_BASE_SCALING;
                    pcVertCur->y = pcVerts[quak].y * AI_MDC_BASE_SCALING;
                    pcVertCur->z = pcVerts[quak].z * AI_MDC_BASE_SCALING;

                    // copy normals
                    MD3::LatLngNormalToVec3( pcVerts[quak].normal, &pcNorCur->x );

                    // copy texture coordinates
                    pcUVCur->x = pcUVs[quak].u;
                    pcUVCur->y = ai_real( 1.0 )-pcUVs[quak].v; // DX to OGL
                }
                pcVertCur->x += pcFrame->localOrigin[0] ;
                pcVertCur->y += pcFrame->localOrigin[1] ;
                pcVertCur->z += pcFrame->localOrigin[2] ;
            }

            // swap the face order - DX to OGL
            pcFaceCur->mIndices[0] = iOutIndex + 2;
            pcFaceCur->mIndices[1] = iOutIndex + 1;
            pcFaceCur->mIndices[2] = iOutIndex + 0;
        }

        pcSurface =  new ((int8_t*)pcSurface + pcSurface->ulOffsetEnd) MDC::Surface;
    }

    // create a flat node graph with a root node and one child for each surface
    if (!pScene->mNumMeshes)
        throw DeadlyImportError( "Invalid MDC file: File contains no valid mesh");
    else if (1 == pScene->mNumMeshes)
    {
        pScene->mRootNode = new aiNode();
        if ( nullptr != pScene->mMeshes[0] ) {
            pScene->mRootNode->mName = pScene->mMeshes[0]->mName;
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
    }
    else
    {
        pScene->mRootNode = new aiNode();
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        pScene->mRootNode->mChildren = new aiNode*[pScene->mNumMeshes];
        pScene->mRootNode->mName.Set("<root>");
        for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        {
            aiNode* pcNode = pScene->mRootNode->mChildren[i] = new aiNode();
            pcNode->mParent = pScene->mRootNode;
            pcNode->mName = pScene->mMeshes[i]->mName;
            pcNode->mNumMeshes = 1;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
        }
    }

    // create materials
    pScene->mNumMaterials = (unsigned int)aszShaders.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[i] = pcMat;

        const std::string& name = aszShaders[i];

        int iMode = (int)aiShadingMode_Gouraud;
        pcMat->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // add a small ambient color value - RtCW seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (name.length())clr.b = clr.g = clr.r = 1.0f;
        else clr.b = clr.g = clr.r = 0.6f;

        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        if (name.length())
        {
            aiString path;
            path.Set(name);
            pcMat->AddProperty(&path,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }
}